

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstructorCache.cpp
# Opt level: O1

void __thiscall Js::ConstructorCache::UpdateInlineSlotCount(ConstructorCache *this)

{
  ulong uVar1;
  long lVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  ConstructorCache *pCVar6;
  
  bVar4 = IsConsistent(this);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ConstructorCache.cpp"
                                ,0x71,"(IsConsistent())","IsConsistent()");
    if (!bVar4) goto LAB_0096f105;
    *puVar5 = 0;
  }
  if (((this->content).field_0x14 & 1) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ConstructorCache.cpp"
                                ,0x72,"(this->content.isPopulated)","this->content.isPopulated");
    if (!bVar4) goto LAB_0096f105;
    *puVar5 = 0;
  }
  uVar1 = (this->super_PropertyGuard).value;
  if ((uVar1 < 2) && ((uVar1 != 1 || (((this->content).field_0x14 & 4) == 0)))) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ConstructorCache.cpp"
                                ,0x73,"(IsEnabled() || NeedsTypeUpdate())",
                                "IsEnabled() || NeedsTypeUpdate()");
    if (!bVar4) goto LAB_0096f105;
    *puVar5 = 0;
  }
  pCVar6 = (ConstructorCache *)&(this->content).pendingType;
  if (((this->content).field_0x14 & 4) == 0) {
    pCVar6 = this;
  }
  lVar2 = *(long *)((pCVar6->super_PropertyGuard).value + 0x28);
  if ((int)(this->content).inlineSlotCount < (int)(uint)*(ushort *)(lVar2 + 0x12)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ConstructorCache.cpp"
                                ,0x7f,
                                "(typeHandler->GetInlineSlotCapacity() <= this->content.inlineSlotCount)"
                                ,
                                "typeHandler->GetInlineSlotCapacity() <= this->content.inlineSlotCount"
                               );
    if (!bVar4) goto LAB_0096f105;
    *puVar5 = 0;
  }
  if ((this->content).slotCount < *(int *)(lVar2 + 0xc)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ConstructorCache.cpp"
                                ,0x81,"(typeHandler->GetSlotCapacity() <= this->content.slotCount)",
                                "typeHandler->GetSlotCapacity() <= this->content.slotCount");
    if (!bVar4) goto LAB_0096f105;
    *puVar5 = 0;
  }
  (this->content).slotCount = *(Type *)(lVar2 + 0xc);
  (this->content).inlineSlotCount = *(Type *)(lVar2 + 0x12);
  bVar4 = IsConsistent(this);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ConstructorCache.cpp"
                                ,0x84,"(IsConsistent())","IsConsistent()");
    if (!bVar4) {
LAB_0096f105:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  return;
}

Assistant:

void ConstructorCache::UpdateInlineSlotCount()
    {
        Assert(IsConsistent());
        Assert(this->content.isPopulated);
        Assert(IsEnabled() || NeedsTypeUpdate());
        DynamicType* type;
        if (this->content.typeUpdatePending)
        {
            type = this->content.pendingType;
        }
        else
        {
            type = reinterpret_cast<DynamicType*>(this->GetValue());
        }
        DynamicTypeHandler* typeHandler = type->GetTypeHandler();
        // Inline slot capacity should never grow as a result of shrinking.
        Assert(typeHandler->GetInlineSlotCapacity() <= this->content.inlineSlotCount);
        // Slot capacity should never grow as a result of shrinking.
        Assert(typeHandler->GetSlotCapacity() <= this->content.slotCount);
        this->content.slotCount = typeHandler->GetSlotCapacity();
        this->content.inlineSlotCount = typeHandler->GetInlineSlotCapacity();
        Assert(IsConsistent());
    }